

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O0

void cpp_bindgen::_impl::
     add_entity<cpp_bindgen::_impl::c_bindings_traits,void(bindgen_fortran_array_descriptor*),char_const*&>
               (char *name,char **params)

{
  char **name_00;
  entities *this;
  _Bind<void_(*(std::_Placeholder<1>,_const_char_*))(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*)>
  local_48;
  generator_t local_38;
  char **local_18;
  char **params_local;
  char *name_local;
  
  local_18 = params;
  params_local = (char **)name;
  this = get_entities<cpp_bindgen::_impl::c_bindings_traits>();
  name_00 = params_local;
  std::bind<void(&)(std::ostream&,char_const*),std::_Placeholder<1>const&,char_const*&>
            ((_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_char_ptr *)&local_48,
             (_Placeholder<1> *)
             c_bindings_traits::generate_entity<void(bindgen_fortran_array_descriptor*)>,
             (char **)&std::placeholders::_1);
  std::function<void(std::ostream&,char_const*)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,char_const*))(std::ostream&,char_const*)>,void>
            ((function<void(std::ostream&,char_const*)> *)&local_38,&local_48);
  entities::add(this,(char *)name_00,&local_38);
  std::function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*)>::~function
            (&local_38);
  return;
}

Assistant:

void add_entity(const char *name, Params &&... params) {
            get_entities<Traits>().add(name,
                std::bind(Traits::template generate_entity<Signature>,
                    std::placeholders::_1,
                    std::forward<Params>(params)...));
        }